

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O1

ListNode * list_add(ListNode *head,ListNode *new_node)

{
  if (head == (ListNode *)0x0) {
    cm_print_error("%s\n","head");
    _fail("/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/build_O1/_deps/cmocka-src/src/cmocka.c"
          ,0x26e);
  }
  if (new_node != (ListNode *)0x0) {
    new_node->next = head;
    new_node->prev = head->prev;
    head->prev->next = new_node;
    head->prev = new_node;
    return new_node;
  }
  cm_print_error("%s\n","new_node");
  _fail("/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/build_O1/_deps/cmocka-src/src/cmocka.c"
        ,0x26f);
}

Assistant:

static ListNode* list_add(ListNode * const head, ListNode *new_node) {
    assert_non_null(head);
    assert_non_null(new_node);
    new_node->next = head;
    new_node->prev = head->prev;
    head->prev->next = new_node;
    head->prev = new_node;
    return new_node;
}